

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

bool kratos::CombinationalLoopVisitor::has_var(Var *var,Var *target)

{
  bool bVar1;
  
  while( true ) {
    if (var == (Var *)0x0) {
      return false;
    }
    if (var == target) {
      return true;
    }
    if (var->type_ != Expression) {
      return false;
    }
    bVar1 = has_var((Var *)var[1].super_IRNode.fn_name_ln.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,target);
    if (bVar1) break;
    var = (Var *)var[1].super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  }
  return true;
}

Assistant:

static bool has_var(Var* var, Var* target) {
        if (!var) return false;
        if (var == target) return true;
        if (var->type() == VarType::Expression) {
            auto* expr = reinterpret_cast<Expr*>(var);
            return has_var(expr->left, target) || has_var(expr->right, target);
        }
        return false;
    }